

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *ci,_Bool newsession)

{
  FILE *pFVar1;
  int iVar2;
  bool bVar3;
  _Bool local_71;
  char *pcStack_70;
  _Bool headerline;
  char *lineptr;
  dynbuf buf;
  FILE *fp;
  FILE *pFStack_38;
  int i;
  FILE *handle;
  CookieInfo *pCStack_28;
  _Bool newsession_local;
  CookieInfo *ci_local;
  char *file_local;
  Curl_easy *data_local;
  
  pFStack_38 = (FILE *)0x0;
  pCStack_28 = ci;
  if (ci == (CookieInfo *)0x0) {
    pCStack_28 = (CookieInfo *)(*Curl_ccalloc)(1,0x7f8);
    if (pCStack_28 == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    for (fp._4_4_ = 0; fp._4_4_ < 0x3f; fp._4_4_ = fp._4_4_ + 1) {
      Curl_llist_init(pCStack_28->cookielist + fp._4_4_,(Curl_llist_dtor)0x0);
    }
    pCStack_28->next_expiration = 0x7fffffffffffffff;
  }
  pCStack_28->newsession = newsession;
  if (data != (Curl_easy *)0x0) {
    buf.toobig = 0;
    pFVar1 = pFStack_38;
    if ((file != (char *)0x0) && (*file != '\0')) {
      iVar2 = strcmp(file,"-");
      if (iVar2 == 0) {
        buf.toobig = _stdin;
      }
      else {
        buf.toobig = (size_t)fopen64(file,"rb");
        pFVar1 = (FILE *)buf.toobig;
        if (((((FILE *)buf.toobig == (FILE *)0x0) && (pFVar1 = pFStack_38, data != (Curl_easy *)0x0)
             ) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
           (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))
        {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
        }
      }
    }
    pFStack_38 = pFVar1;
    pCStack_28->running = false;
    if (buf.toobig != 0) {
      Curl_dyn_init((dynbuf *)&lineptr,5000);
      while (iVar2 = Curl_get_line((dynbuf *)&lineptr,(FILE *)buf.toobig), iVar2 != 0) {
        pcStack_70 = Curl_dyn_ptr((dynbuf *)&lineptr);
        local_71 = false;
        iVar2 = curl_strnequal(pcStack_70,"Set-Cookie:",0xb);
        if (iVar2 != 0) {
          pcStack_70 = pcStack_70 + 0xb;
          local_71 = true;
          while( true ) {
            bVar3 = false;
            if ((*pcStack_70 != '\0') && (bVar3 = true, *pcStack_70 != ' ')) {
              bVar3 = *pcStack_70 == '\t';
            }
            if (!bVar3) break;
            pcStack_70 = pcStack_70 + 1;
          }
        }
        Curl_cookie_add(data,pCStack_28,local_71,true,pcStack_70,(char *)0x0,(char *)0x0,true);
      }
      Curl_dyn_free((dynbuf *)&lineptr);
      remove_expired(pCStack_28);
      if (pFStack_38 != (FILE *)0x0) {
        fclose(pFStack_38);
      }
    }
    *(uint *)&(data->state).field_0x774 = *(uint *)&(data->state).field_0x774 & 0xfffff7ff | 0x800;
  }
  pCStack_28->running = true;
  return pCStack_28;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *ci,
                                    bool newsession)
{
  FILE *handle = NULL;

  if(!ci) {
    int i;

    /* we did not get a struct, create one */
    ci = calloc(1, sizeof(struct CookieInfo));
    if(!ci)
      return NULL; /* failed to get memory */

    /* This does not use the destructor callback since we want to add
       and remove to lists while keeping the cookie struct intact */
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_llist_init(&ci->cookielist[i], NULL);
    /*
     * Initialize the next_expiration time to signal that we do not have enough
     * information yet.
     */
    ci->next_expiration = CURL_OFF_T_MAX;
  }
  ci->newsession = newsession; /* new session? */

  if(data) {
    FILE *fp = NULL;
    if(file && *file) {
      if(!strcmp(file, "-"))
        fp = stdin;
      else {
        fp = fopen(file, "rb");
        if(!fp)
          infof(data, "WARNING: failed to open cookie file \"%s\"", file);
        else
          handle = fp;
      }
    }

    ci->running = FALSE; /* this is not running, this is init */
    if(fp) {
      struct dynbuf buf;
      Curl_dyn_init(&buf, MAX_COOKIE_LINE);
      while(Curl_get_line(&buf, fp)) {
        char *lineptr = Curl_dyn_ptr(&buf);
        bool headerline = FALSE;
        if(checkprefix("Set-Cookie:", lineptr)) {
          /* This is a cookie line, get it! */
          lineptr += 11;
          headerline = TRUE;
          while(*lineptr && ISBLANK(*lineptr))
            lineptr++;
        }

        Curl_cookie_add(data, ci, headerline, TRUE, lineptr, NULL, NULL, TRUE);
      }
      Curl_dyn_free(&buf); /* free the line buffer */

      /*
       * Remove expired cookies from the hash. We must make sure to run this
       * after reading the file, and not on every cookie.
       */
      remove_expired(ci);

      if(handle)
        fclose(handle);
    }
    data->state.cookie_engine = TRUE;
  }
  ci->running = TRUE;          /* now, we are running */

  return ci;
}